

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O3

int createNode(lua_State *L)

{
  pointer pVVar1;
  pointer pVVar2;
  EmmyFacade *L_00;
  Arena<Variable> *this;
  int *piVar3;
  _Any_data local_28;
  
  L_00 = EmmyFacade::Get();
  EmmyFacade::GetDebugger((EmmyFacade *)&local_28,(lua_State *)L_00);
  this = Debugger::GetVariableArena((Debugger *)local_28._M_unused._0_8_);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  if (this != (Arena<Variable> *)0x0) {
    pVVar1 = (this->_data).super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pVVar2 = (this->_data).super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&this->_data);
    piVar3 = (int *)lua_newuserdata(L,0x10);
    *piVar3 = (int)((ulong)((long)pVVar1 - (long)pVVar2) >> 3) * 0x286bca1b;
    *(Arena<Variable> **)(piVar3 + 2) = this;
    (*lua_pushstring)(L,"EMMY_META");
    (*lua_rawget)(L,LUA_REGISTRYINDEX);
    (*lua_setmetatable)(L,-2);
  }
  return (uint)(this != (Arena<Variable> *)0x0);
}

Assistant:

int createNode(lua_State* L)
{
	auto arenaRef = EmmyFacade::Get().GetDebugger(L)->GetVariableArena();
	if (arenaRef)
	{
		auto idx = arenaRef->Alloc();
		pushVariable(L, idx);
		return 1;
	}
	else
	{
		return 0;
	}
}